

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

void * memset(void *__s,int __c,size_t __n)

{
  size_t sVar1;
  uchar *s_;
  
  if (__n != 0) {
    sVar1 = 0;
    do {
      *(char *)((long)__s + sVar1) = (char)__c;
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  return __s;
}

Assistant:

void *memset(void *s, int c, size_t n) {
    unsigned char *s_ = s;
    const unsigned char c_ = (unsigned char)c;
    for (size_t i = 0; i < n; ++i) {
        s_[i] = c_;
    }
    return s;
}